

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_linalg.c
# Opt level: O2

void cupdlp_diffTwoNorm(CUPDLPwork *w,cupdlp_float *x,cupdlp_float *y,cupdlp_int len,
                       cupdlp_float *res)

{
  cupdlp_int incx;
  double dVar1;
  
  memcpy(w->buffer2,x,(long)len * 8);
  AddToVector(w->buffer2,-1.0,y,len);
  dVar1 = nrm2(len,w->buffer2,incx);
  *res = dVar1;
  return;
}

Assistant:

void cupdlp_diffTwoNorm(CUPDLPwork *w, const cupdlp_float *x,
                        const cupdlp_float *y, const cupdlp_int len,
                        cupdlp_float *res) {
  CUPDLP_COPY_VEC(w->buffer2, x, cupdlp_float, len);
  cupdlp_float alpha = -1.0;
  cupdlp_axpy(w, len, &alpha, y, w->buffer2);
  cupdlp_twoNorm(w, len, w->buffer2, res);
}